

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PLYReader.hh
# Opt level: O1

void __thiscall OpenMesh::IO::_PLYReader_::~_PLYReader_(_PLYReader_ *this)

{
  (this->super_BaseReader)._vptr_BaseReader = (_func_int **)&PTR___PLYReader__001c31c0;
  std::
  _Rb_tree<int,_std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>,_std::_Select1st<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
  ::~_Rb_tree(&(this->vertexPropertyMap_)._M_t);
  std::
  _Rb_tree<OpenMesh::IO::_PLYReader_::ValueType,_std::pair<const_OpenMesh::IO::_PLYReader_::ValueType,_int>,_std::_Select1st<std::pair<const_OpenMesh::IO::_PLYReader_::ValueType,_int>_>,_std::less<OpenMesh::IO::_PLYReader_::ValueType>,_std::allocator<std::pair<const_OpenMesh::IO::_PLYReader_::ValueType,_int>_>_>
  ::~_Rb_tree(&(this->scalar_size_)._M_t);
  operator_delete(this);
  return;
}

Assistant:

class OPENMESHDLLEXPORT _PLYReader_ : public BaseReader
{
public:

  _PLYReader_();

  std::string get_description() const { return "PLY polygon file format"; }
  std::string get_extensions()  const { return "ply"; }
  std::string get_magic()       const { return "PLY"; }

  bool read(const std::string& _filename,
        BaseImporter& _bi,
        Options& _opt);

  bool read(std::istream& _is,
            BaseImporter& _bi,
            Options& _opt);

  bool can_u_read(const std::string& _filename) const;

  enum ValueType {
    Unsupported,
    ValueTypeINT8, ValueTypeCHAR,
    ValueTypeUINT8, ValueTypeUCHAR,
    ValueTypeINT16, ValueTypeSHORT,
    ValueTypeUINT16, ValueTypeUSHORT,
    ValueTypeINT32, ValueTypeINT,
    ValueTypeUINT32, ValueTypeUINT,
    ValueTypeFLOAT32, ValueTypeFLOAT,
    ValueTypeFLOAT64, ValueTypeDOUBLE
  };

private:

  bool can_u_read(std::istream& _is) const;

  bool read_ascii(std::istream& _in, BaseImporter& _bi, const Options& _opt) const;
  bool read_binary(std::istream& _in, BaseImporter& _bi, bool swap, const Options& _opt) const;

  float readToFloatValue(ValueType _type , std::fstream& _in) const;
  void readCustomProperty(std::istream& _in, BaseImporter& _bi, VertexHandle _vh, const std::string& _propName, const ValueType _valueType) const;

  void readValue(ValueType _type , std::istream& _in, float& _value) const;
  void readValue(ValueType _type, std::istream& _in, double& _value) const;
  void readValue(ValueType _type , std::istream& _in, unsigned int& _value) const;
  void readValue(ValueType _type , std::istream& _in, int& _value) const;

  void readInteger(ValueType _type, std::istream& _in, int& _value) const;
  void readInteger(ValueType _type, std::istream& _in, unsigned int& _value) const;

  /// Read unsupported properties in PLY file
  void consume_input(std::istream& _in, int _count) const {
	  _in.read(reinterpret_cast<char*>(&buff[0]), _count);
  }

  mutable unsigned char buff[8];

  /// Available per file options for reading
  mutable Options options_;

  /// Options that the user wants to read
  mutable Options userOptions_;

  mutable unsigned int vertexCount_;
  mutable unsigned int faceCount_;

  mutable ValueType vertexType_;
  mutable uint vertexDimension_;

  mutable ValueType faceIndexType_;
  mutable ValueType faceEntryType_;

  enum VertexProperty {
    XCOORD,YCOORD,ZCOORD,
    TEXX,TEXY,
    COLORRED,COLORGREEN,COLORBLUE,COLORALPHA,
    XNORM,YNORM,ZNORM, CUSTOM_PROP,
    UNSUPPORTED
  };

  /// Stores sizes of property types
  mutable std::map<ValueType, int> scalar_size_;

  // Number of vertex properties
  mutable unsigned int vertexPropertyCount_;
  struct VertexPropertyInfo
  {
    VertexProperty property;
    ValueType      value;
    std::string    name;//for custom properties
    VertexPropertyInfo():property(UNSUPPORTED),value(Unsupported),name(""){}
    VertexPropertyInfo(VertexProperty _p, ValueType _v):property(_p),value(_v),name(""){}
    VertexPropertyInfo(VertexProperty _p, ValueType _v, const std::string& _n):property(_p),value(_v),name(_n){}
  };
  mutable std::map< int , VertexPropertyInfo > vertexPropertyMap_;

}